

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

bool __thiscall
google::anon_unknown_10::LogFileObject::CreateLogfile(LogFileObject *this,string *time_pid_string)

{
  int __fd;
  FILE *pFVar1;
  char *pcVar2;
  bool bVar3;
  _Alloc_hider __from;
  string linkpath;
  string linkname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string string_filename;
  
  std::operator+(&linkpath,&this->base_filename_,&this->filename_extension_);
  std::operator+(&linkname,&linkpath,time_pid_string);
  std::operator+(&string_filename,&linkname,".log");
  std::__cxx11::string::~string((string *)&linkname);
  std::__cxx11::string::~string((string *)&linkpath);
  __fd = open(string_filename._M_dataplus._M_p,0xc1,(ulong)fLI::FLAGS_logfile_mode);
  if (__fd != -1) {
    fcntl(__fd,2,1);
    pFVar1 = fdopen(__fd,"a");
    this->file_ = (FILE *)pFVar1;
    if (pFVar1 != (FILE *)0x0) {
      bVar3 = true;
      if ((this->symlink_basename_)._M_string_length != 0) {
        pcVar2 = strrchr(string_filename._M_dataplus._M_p,0x2f);
        std::operator+(&linkpath,&this->symlink_basename_,'.');
        std::operator+(&linkname,&linkpath,*(char **)(LogSeverityNames + (long)this->severity_ * 8))
        ;
        std::__cxx11::string::~string((string *)&linkpath);
        linkpath._M_dataplus._M_p = (pointer)&linkpath.field_2;
        linkpath._M_string_length = 0;
        linkpath.field_2._M_local_buf[0] = '\0';
        if (pcVar2 != (char *)0x0) {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,string_filename._M_dataplus._M_p,pcVar2 + 1);
          std::__cxx11::string::operator=((string *)&linkpath,(string *)&local_88);
          std::__cxx11::string::~string((string *)&local_88);
        }
        std::__cxx11::string::append((string *)&linkpath);
        unlink(linkpath._M_dataplus._M_p);
        __from._M_p = pcVar2 + 1;
        if (pcVar2 == (char *)0x0) {
          __from = string_filename._M_dataplus;
        }
        symlink(__from._M_p,linkpath._M_dataplus._M_p);
        if (fLS::FLAGS_log_link_abi_cxx11_->_M_string_length != 0) {
          std::operator+(&local_68,fLS::FLAGS_log_link_abi_cxx11_,"/");
          std::operator+(&local_88,&local_68,&linkname);
          std::__cxx11::string::operator=((string *)&linkpath,(string *)&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_68);
          unlink(linkpath._M_dataplus._M_p);
          symlink(string_filename._M_dataplus._M_p,linkpath._M_dataplus._M_p);
        }
        std::__cxx11::string::~string((string *)&linkpath);
        std::__cxx11::string::~string((string *)&linkname);
      }
      goto LAB_0011fc9e;
    }
    close(__fd);
    unlink(string_filename._M_dataplus._M_p);
  }
  bVar3 = false;
LAB_0011fc9e:
  std::__cxx11::string::~string((string *)&string_filename);
  return bVar3;
}

Assistant:

bool LogFileObject::CreateLogfile(const string& time_pid_string) {
  // string string_filename = base_filename_+filename_extension_+
  //                          time_pid_string;
  // @huihut: path + severity + '_' + file name + ".log"
  string string_filename = base_filename_ + filename_extension_ + time_pid_string + ".log";
  const char* filename = string_filename.c_str();
  int fd = open(filename, O_WRONLY | O_CREAT | O_EXCL, FLAGS_logfile_mode);
  if (fd == -1) return false;
#ifdef HAVE_FCNTL
  // Mark the file close-on-exec. We don't really care if this fails
  fcntl(fd, F_SETFD, FD_CLOEXEC);
#endif

  file_ = fdopen(fd, "a");  // Make a FILE*.
  if (file_ == NULL) {  // Man, we're screwed!
    close(fd);
    unlink(filename);  // Erase the half-baked evidence: an unusable log file
    return false;
  }

  // We try to create a symlink called <program_name>.<severity>,
  // which is easier to use.  (Every time we create a new logfile,
  // we destroy the old symlink and create a new one, so it always
  // points to the latest logfile.)  If it fails, we're sad but it's
  // no error.
  if (!symlink_basename_.empty()) {
    // take directory from filename
    const char* slash = strrchr(filename, PATH_SEPARATOR);
    const string linkname =
      symlink_basename_ + '.' + LogSeverityNames[severity_];
    string linkpath;
    if ( slash ) linkpath = string(filename, slash-filename+1);  // get dirname
    linkpath += linkname;
    unlink(linkpath.c_str());                    // delete old one if it exists

#if defined(OS_WINDOWS)
    // TODO(hamaji): Create lnk file on Windows?
#elif defined(HAVE_UNISTD_H)
    // We must have unistd.h.
    // Make the symlink be relative (in the same dir) so that if the
    // entire log directory gets relocated the link is still valid.
    const char *linkdest = slash ? (slash + 1) : filename;
    if (symlink(linkdest, linkpath.c_str()) != 0) {
      // silently ignore failures
    }

    // Make an additional link to the log file in a place specified by
    // FLAGS_log_link, if indicated
    if (!FLAGS_log_link.empty()) {
      linkpath = FLAGS_log_link + "/" + linkname;
      unlink(linkpath.c_str());                  // delete old one if it exists
      if (symlink(filename, linkpath.c_str()) != 0) {
        // silently ignore failures
      }
    }
#endif
  }

  return true;  // Everything worked
}